

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O2

int synchnet(curl_socket_t f)

{
  int iVar1;
  curl_socklen_t fromaddrlen;
  int i;
  srvr_sockaddr_union_t fromaddr;
  char rbuf [516];
  socklen_t local_250;
  int local_24c;
  sockaddr local_248;
  undefined1 local_238 [528];
  
  while( true ) {
    iVar1 = ioctl(f,0x541b,&local_24c);
    if (local_24c == 0) break;
    local_250 = 0x10;
    recvfrom(f,local_238,0x204,0,&local_248,&local_250);
  }
  return iVar1;
}

Assistant:

static int synchnet(curl_socket_t f /* socket to flush */)
{

#if defined(HAVE_IOCTLSOCKET)
  unsigned long i;
#else
  int i;
#endif
  int j = 0;
  char rbuf[PKTSIZE];
  srvr_sockaddr_union_t fromaddr;
  curl_socklen_t fromaddrlen;

  for (;;) {
#if defined(HAVE_IOCTLSOCKET)
    (void) ioctlsocket(f, FIONREAD, &i);
#else
    (void) ioctl(f, FIONREAD, &i);
#endif
    if (i) {
      j++;
#ifdef ENABLE_IPV6
      if(!use_ipv6)
#endif
        fromaddrlen = sizeof(fromaddr.sa4);
#ifdef ENABLE_IPV6
      else
        fromaddrlen = sizeof(fromaddr.sa6);
#endif
      (void) recvfrom(f, rbuf, sizeof(rbuf), 0,
                      &fromaddr.sa, &fromaddrlen);
    }
    else
      break;
  }
  return j;
}